

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O3

char16 __thiscall UnifiedRegex::CharSet<char16_t>::Singleton(CharSet<char16_t> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  
  if ((this->rep).compact.countPlusOne != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x23b,"(IsSingleton())","IsSingleton()");
    if (!bVar2) goto LAB_00e5f1ae;
    *puVar3 = 0;
  }
  uVar4 = (this->rep).compact.cs[0];
  if (0xffff < uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x23c,"(rep.compact.cs[0] <= MaxUChar)","rep.compact.cs[0] <= MaxUChar");
    if (!bVar2) {
LAB_00e5f1ae:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    uVar4 = (this->rep).compact.cs[0];
    if (0xffff < uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
      if (!bVar2) goto LAB_00e5f1ae;
      *puVar3 = 0;
    }
  }
  return (char16)uVar4;
}

Assistant:

inline char16 Singleton() const
        {
            Assert(IsSingleton());
            Assert(rep.compact.cs[0] <= MaxUChar);
            return UTC(rep.compact.cs[0]);
        }